

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O2

string * getErrorName_abi_cxx11_(string *__return_storage_ptr__,uint error)

{
  char *pcVar1;
  allocator local_9;
  
  switch(error) {
  case 0:
    pcVar1 = "FT_OK";
    break;
  case 1:
    pcVar1 = "FT_INVALID_HANDLE";
    break;
  case 2:
    pcVar1 = "FT_DEVICE_NOT_FOUND";
    break;
  case 3:
    pcVar1 = "FT_DEVICE_NOT_OPENED";
    break;
  case 4:
    pcVar1 = "FT_IO_ERROR";
    break;
  case 5:
    pcVar1 = "FT_INSUFFICIENT_RESOURCES";
    break;
  case 6:
    pcVar1 = "FT_INVALID_PARAMETER";
    break;
  case 7:
    pcVar1 = "FT_INVALID_BAUD_RATE";
    break;
  case 8:
    pcVar1 = "FT_DEVICE_NOT_OPENED_FOR_ERASE";
    break;
  case 9:
    pcVar1 = "FT_DEVICE_NOT_OPENED_FOR_WRITE";
    break;
  case 10:
    pcVar1 = "FT_FAILED_TO_WRITE_DEVICE";
    break;
  case 0xb:
    pcVar1 = "FT_EEPROM_READ_FAILED";
    break;
  case 0xc:
    pcVar1 = "FT_EEPROM_WRITE_FAILED";
    break;
  case 0xd:
    pcVar1 = "FT_EEPROM_ERASE_FAILED";
    break;
  case 0xe:
    pcVar1 = "FT_EEPROM_NOT_PRESENT";
    break;
  case 0xf:
    pcVar1 = "FT_EEPROM_NOT_PROGRAMMED";
    break;
  case 0x10:
    pcVar1 = "FT_INVALID_ARGS";
    break;
  case 0x11:
    pcVar1 = "FT_NOT_SUPPORTED";
    break;
  case 0x12:
    pcVar1 = "FT_OTHER_ERROR";
    break;
  case 0x13:
    pcVar1 = "FT_DEVICE_LIST_NOT_READY";
    break;
  default:
    pcVar1 = "Unknown";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

string getErrorName(unsigned int error) {
    switch (error) {
        case FT_OK:
            return "FT_OK";
        case FT_INVALID_HANDLE:
            return "FT_INVALID_HANDLE";
        case FT_DEVICE_NOT_FOUND:
            return "FT_DEVICE_NOT_FOUND";
        case FT_DEVICE_NOT_OPENED:
            return "FT_DEVICE_NOT_OPENED";
        case FT_IO_ERROR:
            return "FT_IO_ERROR";
        case FT_INSUFFICIENT_RESOURCES:
            return "FT_INSUFFICIENT_RESOURCES";
        case FT_INVALID_PARAMETER:
            return "FT_INVALID_PARAMETER";
        case FT_INVALID_BAUD_RATE:
            return "FT_INVALID_BAUD_RATE";

        case FT_DEVICE_NOT_OPENED_FOR_ERASE:
            return "FT_DEVICE_NOT_OPENED_FOR_ERASE";
        case FT_DEVICE_NOT_OPENED_FOR_WRITE:
            return "FT_DEVICE_NOT_OPENED_FOR_WRITE";
        case FT_FAILED_TO_WRITE_DEVICE:
            return "FT_FAILED_TO_WRITE_DEVICE";
        case FT_EEPROM_READ_FAILED:
            return "FT_EEPROM_READ_FAILED";
        case FT_EEPROM_WRITE_FAILED:
            return "FT_EEPROM_WRITE_FAILED";
        case FT_EEPROM_ERASE_FAILED:
            return "FT_EEPROM_ERASE_FAILED";
        case FT_EEPROM_NOT_PRESENT:
            return "FT_EEPROM_NOT_PRESENT";
        case FT_EEPROM_NOT_PROGRAMMED:
            return "FT_EEPROM_NOT_PROGRAMMED";
        case FT_INVALID_ARGS:
            return "FT_INVALID_ARGS";
        case FT_NOT_SUPPORTED:
            return "FT_NOT_SUPPORTED";
        case FT_OTHER_ERROR:
            return "FT_OTHER_ERROR";
        case FT_DEVICE_LIST_NOT_READY:
            return "FT_DEVICE_LIST_NOT_READY";
        default:
            return "Unknown";
    }
}